

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_brusselator_1D_mri.c
# Opt level: O0

int Jf(sunrealtype t,N_Vector y,N_Vector fy,SUNMatrix Jac,void *user_data,N_Vector tmp1,
      N_Vector tmp2,N_Vector tmp3)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  long lVar5;
  int iVar6;
  char *funcname;
  long *in_RCX;
  long *in_RDX;
  undefined8 in_RDI;
  sunrealtype *Ydata;
  sunrealtype w;
  sunrealtype v;
  sunrealtype u;
  sunindextype i;
  sunrealtype ep;
  sunindextype N;
  UserData udata;
  int in_stack_ffffffffffffff7c;
  void *in_stack_ffffffffffffff88;
  long local_60;
  int local_4;
  
  lVar5 = *in_RCX;
  dVar1 = (double)in_RCX[5];
  funcname = (char *)N_VGetArrayPointer(in_RDI);
  iVar6 = check_retval(in_stack_ffffffffffffff88,funcname,in_stack_ffffffffffffff7c);
  if (iVar6 == 0) {
    for (local_60 = 0; local_60 < lVar5; local_60 = local_60 + 1) {
      dVar2 = *(double *)(funcname + local_60 * 0x18);
      dVar3 = *(double *)(funcname + local_60 * 0x18 + 8);
      dVar4 = *(double *)(funcname + local_60 * 0x18 + 0x10);
      *(double *)
       (*(long *)(*(long *)(*in_RDX + 0x40) + local_60 * 0x18) + *(long *)(*in_RDX + 0x28) * 8) =
           dVar2 * 2.0 * dVar3 + -(dVar4 + 1.0);
      *(double *)
       (*(long *)(*(long *)(*in_RDX + 0x40) + local_60 * 0x18) + (*(long *)(*in_RDX + 0x28) + 1) * 8
       ) = -(dVar2 * 2.0) * dVar3 + dVar4;
      *(double *)
       (*(long *)(*(long *)(*in_RDX + 0x40) + local_60 * 0x18) + (*(long *)(*in_RDX + 0x28) + 2) * 8
       ) = -dVar4;
      *(double *)
       (*(long *)(*(long *)(*in_RDX + 0x40) + 8 + local_60 * 0x18) +
       (*(long *)(*in_RDX + 0x28) + -1) * 8) = dVar2 * dVar2;
      *(double *)
       (*(long *)(*(long *)(*in_RDX + 0x40) + 8 + local_60 * 0x18) + *(long *)(*in_RDX + 0x28) * 8)
           = -dVar2 * dVar2;
      *(double *)
       (*(long *)(*(long *)(*in_RDX + 0x40) + 0x10 + local_60 * 0x18) +
       (*(long *)(*in_RDX + 0x28) + -2) * 8) = -dVar2;
      *(double *)
       (*(long *)(*(long *)(*in_RDX + 0x40) + 0x10 + local_60 * 0x18) +
       (*(long *)(*in_RDX + 0x28) + -1) * 8) = dVar2;
      *(double *)
       (*(long *)(*(long *)(*in_RDX + 0x40) + 0x10 + local_60 * 0x18) +
       *(long *)(*in_RDX + 0x28) * 8) = -1.0 / dVar1 - dVar2;
    }
    local_4 = 0;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int Jf(sunrealtype t, N_Vector y, N_Vector fy, SUNMatrix Jac,
              void* user_data, N_Vector tmp1, N_Vector tmp2, N_Vector tmp3)
{
  UserData udata = (UserData)user_data; /* access problem data */
  sunindextype N = udata->N;            /* set shortcuts */
  sunrealtype ep = udata->ep;
  sunindextype i;
  sunrealtype u, v, w;
  sunrealtype* Ydata = NULL;

  /* access solution array */
  Ydata = N_VGetArrayPointer(y);
  if (check_retval((void*)Ydata, "N_VGetArrayPointer", 0)) { return 1; }

  /* iterate over nodes, filling in Jacobian entries */
  for (i = 0; i < N; i++)
  {
    /* set nodal value shortcuts (shifted index due to start at first interior node) */
    u = Ydata[IDX(i, 0)];
    v = Ydata[IDX(i, 1)];
    w = Ydata[IDX(i, 2)];

    /* all vars wrt u */
    SM_ELEMENT_B(Jac, IDX(i, 0), IDX(i, 0)) = TWO * u * v - (w + ONE);
    SM_ELEMENT_B(Jac, IDX(i, 1), IDX(i, 0)) = w - TWO * u * v;
    SM_ELEMENT_B(Jac, IDX(i, 2), IDX(i, 0)) = -w;

    /* all vars wrt v */
    SM_ELEMENT_B(Jac, IDX(i, 0), IDX(i, 1)) = u * u;
    SM_ELEMENT_B(Jac, IDX(i, 1), IDX(i, 1)) = -u * u;

    /* all vars wrt w */
    SM_ELEMENT_B(Jac, IDX(i, 0), IDX(i, 2)) = -u;
    SM_ELEMENT_B(Jac, IDX(i, 1), IDX(i, 2)) = u;
    SM_ELEMENT_B(Jac, IDX(i, 2), IDX(i, 2)) = -ONE / ep - u;
  }

  /* return success */
  return (0);
}